

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

int __thiscall HydEngine::close(HydEngine *this,int __fd)

{
  int in_EAX;
  
  if (this->engineState != CLOSED) {
    if (this->matrixSolver != (MatrixSolver *)0x0) {
      in_EAX = (*this->matrixSolver->_vptr_MatrixSolver[1])();
    }
    this->matrixSolver = (MatrixSolver *)0x0;
    if (this->hydSolver != (HydSolver *)0x0) {
      in_EAX = (*this->hydSolver->_vptr_HydSolver[1])();
    }
    this->hydSolver = (HydSolver *)0x0;
    this->engineState = CLOSED;
  }
  return in_EAX;
}

Assistant:

void HydEngine::close()
{
    if ( engineState == HydEngine::CLOSED ) return;
    delete matrixSolver;
    matrixSolver = nullptr;
    delete hydSolver;
    hydSolver = nullptr;
    engineState = HydEngine::CLOSED;

    //... Other objects created in HydEngine::open() belong to the
    //    network object and are deleted by it.
}